

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_consume.c
# Opt level: O1

int mpt_iterator_consume(mpt_iterator *it,mpt_type_t type,void *dest)

{
  size_t __n;
  int iVar1;
  int iVar2;
  mpt_value *val;
  undefined1 *dest_00;
  uint8_t tmp [32];
  undefined1 auStack_58 [40];
  
  dest_00 = auStack_58;
  val = (*it->_vptr->value)(it);
  if (type == 0) {
    if (val == (mpt_value *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = (int)val->_type;
      if (0xfff < val->_type) {
        iVar1 = 0;
      }
    }
    iVar2 = (*it->_vptr->advance)(it);
    if (iVar2 < 0) {
      iVar1 = iVar2;
    }
  }
  else if (val == (mpt_value *)0x0) {
    iVar1 = -0x10;
  }
  else {
    iVar1 = -3;
    if ((type - 0x62 < 0x18) && ((0xcc949fU >> ((uint)(type - 0x62) & 0x1f) & 1) != 0)) {
      __n = *(size_t *)("skip object assignment" + type * 8 + 0xb);
      if (dest == (void *)0x0) {
        dest_00 = (undefined1 *)0x0;
      }
      iVar1 = mpt_value_convert(val,type,dest_00);
      if (-1 < iVar1) {
        iVar1 = (int)val->_type;
        iVar2 = (*it->_vptr->advance)(it);
        if (iVar2 < 0) {
          iVar1 = 1;
        }
        else if (dest != (void *)0x0) {
          memcpy(dest,auStack_58,__n);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_iterator_consume(MPT_INTERFACE(iterator) *it, MPT_TYPE(type) type, void *dest)
{
	const MPT_STRUCT(value) *val = it->_vptr->value(it);
	uint8_t tmp[32];
	size_t len;
	int ret;
	
	/* skip current value */
	if (!type) {
		if (val && (val->_type <= MPT_ENUM(_TypeValueMax))) {
			type = val->_type;
		}
		if ((ret = it->_vptr->advance(it)) < 0) {
			return ret;
		}
		return type;
	}
	/* no data to work with */
	if (!val) {
		return MPT_ERROR(MissingData);
	}
	/* limit options to known self-sufficent types */
	switch (type) {
		case 'c': len = sizeof(char); break;
		case 'b': len = sizeof(int8_t); break;
		case 'y': len = sizeof(uint8_t); break;
		case 'n': len = sizeof(int16_t); break;
		case 'q': len = sizeof(uint16_t); break;
		case 'i': len = sizeof(int32_t); break;
		case 'u': len = sizeof(uint32_t); break;
		case 'x': len = sizeof(int64_t); break;
		case 't': len = sizeof(uint64_t); break;
		
		case 'l': len = sizeof(long); break;
		
		case 'f': len = sizeof(float); break;
		case 'd': len = sizeof(double); break;
#ifdef _MPT_FLOAT_EXTENDED_H
		case 'e': len = sizeof(long double); break;
#endif
		default: return MPT_ERROR(BadType);
	}
	if ((ret = mpt_value_convert(val, type, dest ? tmp : 0)) < 0) {
		return ret;
	}
	/* save origin type, iterator advance invalidates value pointer */
	type = val->_type;
	if ((ret = it->_vptr->advance(it) < 0)) {
		return ret;
	}
	if (dest) {
		memcpy(dest, tmp, len);
	}
	return type;
}